

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O1

uint256 * __thiscall
CPartialMerkleTree::CalcHash
          (uint256 *__return_storage_ptr__,CPartialMerkleTree *this,int height,uint pos,
          vector<uint256,_std::allocator<uint256>_> *vTxid)

{
  uint pos_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  base_blob<256U> *pbVar4;
  pointer puVar5;
  int height_00;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  uint256 left;
  uint256 local_d8;
  uint256 local_b8;
  CSHA256 local_98;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = (vTxid->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((vTxid->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.super__Vector_impl_data
      ._M_finish == puVar5) {
    __assert_fail("vTxid.size() != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/merkleblock.cpp"
                  ,0x3d,
                  "uint256 CPartialMerkleTree::CalcHash(int, unsigned int, const std::vector<uint256> &)"
                 );
  }
  if (height == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_006ca843;
    puVar5 = puVar5 + pos;
    uVar1 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
    uVar2 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
    uVar3 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x10) =
         *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar3;
    *(undefined8 *)(__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems = uVar1;
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 8) = uVar2;
  }
  else {
    height_00 = height + -1;
    CalcHash(&local_b8,this,height_00,pos * 2,vTxid);
    local_d8.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_d8.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    pos_00 = pos * 2 + 1;
    if (pos_00 < ~(-1 << ((byte)height_00 & 0x1f)) + this->nTransactions >> ((byte)height_00 & 0x1f)
       ) {
      CalcHash(&local_d8,this,height_00,pos_00,vTxid);
    }
    else {
      local_d8.super_base_blob<256U>.m_data._M_elems[0x10] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0x10];
      local_d8.super_base_blob<256U>.m_data._M_elems[0x11] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0x11];
      local_d8.super_base_blob<256U>.m_data._M_elems[0x12] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0x12];
      local_d8.super_base_blob<256U>.m_data._M_elems[0x13] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0x13];
      local_d8.super_base_blob<256U>.m_data._M_elems[0x14] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0x14];
      local_d8.super_base_blob<256U>.m_data._M_elems[0x15] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0x15];
      local_d8.super_base_blob<256U>.m_data._M_elems[0x16] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0x16];
      local_d8.super_base_blob<256U>.m_data._M_elems[0x17] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0x17];
      local_d8.super_base_blob<256U>.m_data._M_elems[0x18] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0x18];
      local_d8.super_base_blob<256U>.m_data._M_elems[0x19] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0x19];
      local_d8.super_base_blob<256U>.m_data._M_elems[0x1a] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0x1a];
      local_d8.super_base_blob<256U>.m_data._M_elems[0x1b] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0x1b];
      local_d8.super_base_blob<256U>.m_data._M_elems[0x1c] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0x1c];
      local_d8.super_base_blob<256U>.m_data._M_elems[0x1d] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0x1d];
      local_d8.super_base_blob<256U>.m_data._M_elems[0x1e] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0x1e];
      local_d8.super_base_blob<256U>.m_data._M_elems[0x1f] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0x1f];
      local_d8.super_base_blob<256U>.m_data._M_elems[0] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0];
      local_d8.super_base_blob<256U>.m_data._M_elems[1] =
           local_b8.super_base_blob<256U>.m_data._M_elems[1];
      local_d8.super_base_blob<256U>.m_data._M_elems[2] =
           local_b8.super_base_blob<256U>.m_data._M_elems[2];
      local_d8.super_base_blob<256U>.m_data._M_elems[3] =
           local_b8.super_base_blob<256U>.m_data._M_elems[3];
      local_d8.super_base_blob<256U>.m_data._M_elems[4] =
           local_b8.super_base_blob<256U>.m_data._M_elems[4];
      local_d8.super_base_blob<256U>.m_data._M_elems[5] =
           local_b8.super_base_blob<256U>.m_data._M_elems[5];
      local_d8.super_base_blob<256U>.m_data._M_elems[6] =
           local_b8.super_base_blob<256U>.m_data._M_elems[6];
      local_d8.super_base_blob<256U>.m_data._M_elems[7] =
           local_b8.super_base_blob<256U>.m_data._M_elems[7];
      local_d8.super_base_blob<256U>.m_data._M_elems[8] =
           local_b8.super_base_blob<256U>.m_data._M_elems[8];
      local_d8.super_base_blob<256U>.m_data._M_elems[9] =
           local_b8.super_base_blob<256U>.m_data._M_elems[9];
      local_d8.super_base_blob<256U>.m_data._M_elems[10] =
           local_b8.super_base_blob<256U>.m_data._M_elems[10];
      local_d8.super_base_blob<256U>.m_data._M_elems[0xb] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0xb];
      local_d8.super_base_blob<256U>.m_data._M_elems[0xc] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0xc];
      local_d8.super_base_blob<256U>.m_data._M_elems[0xd] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0xd];
      local_d8.super_base_blob<256U>.m_data._M_elems[0xe] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0xe];
      local_d8.super_base_blob<256U>.m_data._M_elems[0xf] =
           local_b8.super_base_blob<256U>.m_data._M_elems[0xf];
    }
    pbVar4 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0x10] = '\0';
    (pbVar4->m_data)._M_elems[0x11] = '\0';
    (pbVar4->m_data)._M_elems[0x12] = '\0';
    (pbVar4->m_data)._M_elems[0x13] = '\0';
    (pbVar4->m_data)._M_elems[0x14] = '\0';
    (pbVar4->m_data)._M_elems[0x15] = '\0';
    (pbVar4->m_data)._M_elems[0x16] = '\0';
    (pbVar4->m_data)._M_elems[0x17] = '\0';
    pbVar4 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0x18] = '\0';
    (pbVar4->m_data)._M_elems[0x19] = '\0';
    (pbVar4->m_data)._M_elems[0x1a] = '\0';
    (pbVar4->m_data)._M_elems[0x1b] = '\0';
    (pbVar4->m_data)._M_elems[0x1c] = '\0';
    (pbVar4->m_data)._M_elems[0x1d] = '\0';
    (pbVar4->m_data)._M_elems[0x1e] = '\0';
    (pbVar4->m_data)._M_elems[0x1f] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[1] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[2] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[3] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[4] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[5] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[6] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[7] = '\0';
    pbVar4 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[8] = '\0';
    (pbVar4->m_data)._M_elems[9] = '\0';
    (pbVar4->m_data)._M_elems[10] = '\0';
    (pbVar4->m_data)._M_elems[0xb] = '\0';
    (pbVar4->m_data)._M_elems[0xc] = '\0';
    (pbVar4->m_data)._M_elems[0xd] = '\0';
    (pbVar4->m_data)._M_elems[0xe] = '\0';
    (pbVar4->m_data)._M_elems[0xf] = '\0';
    local_98.buf[0x30] = '\0';
    local_98.buf[0x31] = '\0';
    local_98.buf[0x32] = '\0';
    local_98.buf[0x33] = '\0';
    local_98.buf[0x34] = '\0';
    local_98.buf[0x35] = '\0';
    local_98.buf[0x36] = '\0';
    local_98.buf[0x37] = '\0';
    local_98.buf[0x38] = '\0';
    local_98.buf[0x39] = '\0';
    local_98.buf[0x3a] = '\0';
    local_98.buf[0x3b] = '\0';
    local_98.buf[0x3c] = '\0';
    local_98.buf[0x3d] = '\0';
    local_98.buf[0x3e] = '\0';
    local_98.buf[0x3f] = '\0';
    local_98.buf[0x20] = '\0';
    local_98.buf[0x21] = '\0';
    local_98.buf[0x22] = '\0';
    local_98.buf[0x23] = '\0';
    local_98.buf[0x24] = '\0';
    local_98.buf[0x25] = '\0';
    local_98.buf[0x26] = '\0';
    local_98.buf[0x27] = '\0';
    local_98.buf[0x28] = '\0';
    local_98.buf[0x29] = '\0';
    local_98.buf[0x2a] = '\0';
    local_98.buf[0x2b] = '\0';
    local_98.buf[0x2c] = '\0';
    local_98.buf[0x2d] = '\0';
    local_98.buf[0x2e] = '\0';
    local_98.buf[0x2f] = '\0';
    local_98.buf[0x10] = '\0';
    local_98.buf[0x11] = '\0';
    local_98.buf[0x12] = '\0';
    local_98.buf[0x13] = '\0';
    local_98.buf[0x14] = '\0';
    local_98.buf[0x15] = '\0';
    local_98.buf[0x16] = '\0';
    local_98.buf[0x17] = '\0';
    local_98.buf[0x18] = '\0';
    local_98.buf[0x19] = '\0';
    local_98.buf[0x1a] = '\0';
    local_98.buf[0x1b] = '\0';
    local_98.buf[0x1c] = '\0';
    local_98.buf[0x1d] = '\0';
    local_98.buf[0x1e] = '\0';
    local_98.buf[0x1f] = '\0';
    local_98.buf[0] = '\0';
    local_98.buf[1] = '\0';
    local_98.buf[2] = '\0';
    local_98.buf[3] = '\0';
    local_98.buf[4] = '\0';
    local_98.buf[5] = '\0';
    local_98.buf[6] = '\0';
    local_98.buf[7] = '\0';
    local_98.buf[8] = '\0';
    local_98.buf[9] = '\0';
    local_98.buf[10] = '\0';
    local_98.buf[0xb] = '\0';
    local_98.buf[0xc] = '\0';
    local_98.buf[0xd] = '\0';
    local_98.buf[0xe] = '\0';
    local_98.buf[0xf] = '\0';
    local_98.s[4] = 0;
    local_98.s[5] = 0;
    local_98.s[6] = 0;
    local_98.s[7] = 0;
    local_98.s[0] = 0;
    local_98.s[1] = 0;
    local_98.s[2] = 0;
    local_98.s[3] = 0;
    local_98.bytes = 0;
    CSHA256::CSHA256(&local_98);
    CSHA256::Write(&local_98,(uchar *)&local_b8,0x20);
    CSHA256::Write(&local_98,(uchar *)&local_d8,0x20);
    output.m_size = 0x20;
    output.m_data = (uchar *)__return_storage_ptr__;
    CHash256::Finalize((CHash256 *)&local_98,output);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_006ca843:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

uint256 CPartialMerkleTree::CalcHash(int height, unsigned int pos, const std::vector<uint256> &vTxid) {
    //we can never have zero txs in a merkle block, we always need the coinbase tx
    //if we do not have this assert, we can hit a memory access violation when indexing into vTxid
    assert(vTxid.size() != 0);
    if (height == 0) {
        // hash at height 0 is the txids themselves
        return vTxid[pos];
    } else {
        // calculate left hash
        uint256 left = CalcHash(height-1, pos*2, vTxid), right;
        // calculate right hash if not beyond the end of the array - copy left hash otherwise
        if (pos*2+1 < CalcTreeWidth(height-1))
            right = CalcHash(height-1, pos*2+1, vTxid);
        else
            right = left;
        // combine subhashes
        return Hash(left, right);
    }
}